

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQGenerator::SQGenerator(SQGenerator *this,SQSharedState *ss,SQClosure *closure)

{
  (this->super_SQCollectable).super_SQRefCounted._uiRef = 0;
  (this->super_SQCollectable).super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQGenerator_001462b0;
  (this->_closure).super_SQObject._type = OT_NULL;
  (this->_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_stack)._vals = (SQObjectPtr *)0x0;
  (this->_stack)._size = 0;
  (this->_stack)._allocated = 0;
  (this->_ci)._closure.super_SQObject._type = OT_NULL;
  (this->_ci)._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_etraps)._vals = (SQExceptionTrap *)0x0;
  (this->_etraps)._size = 0;
  (this->_etraps)._allocated = 0;
  SQObjectPtr::operator=(&this->_closure,closure);
  this->_state = eRunning;
  (this->_ci)._generator = (SQGenerator *)0x0;
  (this->super_SQCollectable)._next = (SQCollectable *)0x0;
  (this->super_SQCollectable)._prev = (SQCollectable *)0x0;
  (this->super_SQCollectable)._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQGenerator(SQSharedState *ss,SQClosure *closure){_closure=closure;_state=eRunning;_ci._generator=NULL;INIT_CHAIN();ADD_TO_CHAIN(&_ss(this)->_gc_chain,this);}